

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaPrivate::highlightNextSubWindow(QMdiAreaPrivate *this,int increaseFactor)

{
  QWidget *p;
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  QMdiSubWindow *pQVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  long lVar5;
  QMdiSubWindow *pQVar6;
  int iVar7;
  QAnyStringView QVar8;
  
  if ((this->childWindows).d.size != 1) {
    p = *(QWidget **)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
          field_0x8;
    iVar7 = this->indexToHighlighted;
    if (iVar7 < 0) {
      pQVar4 = QMdiArea::currentSubWindow((QMdiArea *)p);
      if (pQVar4 == (QMdiSubWindow *)0x0) {
        return;
      }
      lVar1 = (this->childWindows).d.size;
      if (lVar1 == 0) {
LAB_00441789:
        iVar7 = -1;
      }
      else {
        pQVar2 = (this->childWindows).d.ptr;
        lVar5 = 0;
        iVar7 = -1;
        do {
          if (lVar1 << 4 == lVar5) goto LAB_00441789;
          lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar5);
          if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
            pQVar6 = (QMdiSubWindow *)0x0;
          }
          else {
            pQVar6 = *(QMdiSubWindow **)((long)&(pQVar2->wp).value + lVar5);
          }
          lVar5 = lVar5 + 0x10;
          iVar7 = iVar7 + 1;
        } while (pQVar6 != pQVar4);
      }
      this->indexToHighlighted = iVar7;
    }
    pQVar4 = nextVisibleSubWindow(this,increaseFactor,this->activationOrder,-1,iVar7);
    if (pQVar4 != (QMdiSubWindow *)0x0) {
      if (this->rubberBand == (QRubberBand *)0x0) {
        this_00.m_data = operator_new(0x28);
        QRubberBand::QRubberBand((QRubberBand *)this_00.m_data,Rectangle,p);
        this->rubberBand = (QRubberBand *)this_00;
        QVar8.m_size = (size_t)"qt_rubberband";
        QVar8.field_0.m_data = this_00.m_data;
        QObject::setObjectName(QVar8);
        QWidget::setWindowFlags
                  (&this->rubberBand->super_QWidget,
                   (WindowFlags)
                   ((((this->rubberBand->super_QWidget).data)->window_flags).
                    super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>
                    .i | 0x40000));
      }
      if ((this->tabToPreviousTimer).m_id == Invalid) {
        showRubberBandFor(this,pQVar4);
      }
      lVar1 = (this->childWindows).d.size;
      if (lVar1 == 0) {
LAB_00441873:
        iVar7 = -1;
      }
      else {
        pQVar2 = (this->childWindows).d.ptr;
        lVar5 = 0;
        iVar7 = -1;
        do {
          if (lVar1 << 4 == lVar5) goto LAB_00441873;
          lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar5);
          if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
            pQVar6 = (QMdiSubWindow *)0x0;
          }
          else {
            pQVar6 = *(QMdiSubWindow **)((long)&(pQVar2->wp).value + lVar5);
          }
          lVar5 = lVar5 + 0x10;
          iVar7 = iVar7 + 1;
        } while (pQVar6 != pQVar4);
      }
      this->indexToHighlighted = iVar7;
    }
  }
  return;
}

Assistant:

void QMdiAreaPrivate::highlightNextSubWindow(int increaseFactor)
{
    if (childWindows.size() == 1)
        return;

    Q_Q(QMdiArea);
    // There's no highlighted sub-window atm, use current.
    if (indexToHighlighted < 0) {
        QMdiSubWindow *current = q->currentSubWindow();
        if (!current)
            return;
        indexToHighlighted = childWindows.indexOf(current);
    }

    Q_ASSERT(indexToHighlighted >= 0);
    Q_ASSERT(indexToHighlighted < childWindows.size());

    QMdiSubWindow *highlight = nextVisibleSubWindow(increaseFactor, activationOrder, -1, indexToHighlighted);
    if (!highlight)
        return;

#if QT_CONFIG(rubberband)
    if (!rubberBand) {
        rubberBand = new QRubberBand(QRubberBand::Rectangle, q);
        // For accessibility to identify this special widget.
        rubberBand->setObjectName("qt_rubberband"_L1);
        rubberBand->setWindowFlags(rubberBand->windowFlags() | Qt::WindowStaysOnTopHint);
    }
#endif

    // Only highlight if we're not switching back to the previously active window (Ctrl-Tab once).
#if QT_CONFIG(rubberband)
    if (!tabToPreviousTimer.isActive())
        showRubberBandFor(highlight);
#endif

    indexToHighlighted = childWindows.indexOf(highlight);
    Q_ASSERT(indexToHighlighted >= 0);
}